

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void encodeUTF8(uint32_t UnicodeScalarValue,SmallVectorImpl<char> *Result)

{
  byte local_2b;
  byte local_2a;
  byte local_29;
  byte local_28;
  byte local_27;
  byte local_26;
  byte local_25;
  byte local_24;
  byte local_23;
  uint8_t local_22;
  byte local_21;
  byte local_20;
  uint8_t FourthByte;
  uint8_t ThirdByte_1;
  uint8_t SecondByte_2;
  uint8_t FirstByte_2;
  byte local_1b;
  byte local_1a;
  byte local_19;
  uint8_t ThirdByte;
  uint8_t SecondByte_1;
  uint8_t FirstByte_1;
  uint8_t SecondByte;
  uint8_t FirstByte;
  SmallVectorImpl<char> *Result_local;
  uint32_t UnicodeScalarValue_local;
  
  local_19 = (byte)UnicodeScalarValue;
  _ThirdByte = Result;
  Result_local._4_4_ = UnicodeScalarValue;
  if (UnicodeScalarValue < 0x80) {
    local_19 = local_19 & 0x7f;
    llvm::SmallVectorTemplateBase<char,_true>::push_back
              (&Result->super_SmallVectorTemplateBase<char,_true>,(char *)&local_19);
  }
  else if (UnicodeScalarValue < 0x800) {
    FirstByte_2 = (byte)((UnicodeScalarValue & 0x7c0) >> 6) | 0xc0;
    local_1b = local_19 & 0x3f | 0x80;
    local_1a = FirstByte_2;
    llvm::SmallVectorTemplateBase<char,_true>::push_back
              (&Result->super_SmallVectorTemplateBase<char,_true>,(char *)&FirstByte_2);
    SecondByte_2 = local_1b;
    llvm::SmallVectorTemplateBase<char,_true>::push_back
              (&_ThirdByte->super_SmallVectorTemplateBase<char,_true>,(char *)&SecondByte_2);
  }
  else if (UnicodeScalarValue < 0x10000) {
    local_21 = (byte)((UnicodeScalarValue & 0xf000) >> 0xc) | 0xe0;
    FourthByte = (byte)((UnicodeScalarValue & 0xfc0) >> 6) | 0x80;
    local_20 = local_19 & 0x3f | 0x80;
    ThirdByte_1 = local_21;
    llvm::SmallVectorTemplateBase<char,_true>::push_back
              (&Result->super_SmallVectorTemplateBase<char,_true>,(char *)&local_21);
    local_22 = FourthByte;
    llvm::SmallVectorTemplateBase<char,_true>::push_back
              (&_ThirdByte->super_SmallVectorTemplateBase<char,_true>,(char *)&local_22);
    local_23 = local_20;
    llvm::SmallVectorTemplateBase<char,_true>::push_back
              (&_ThirdByte->super_SmallVectorTemplateBase<char,_true>,(char *)&local_23);
  }
  else if (UnicodeScalarValue < 0x110000) {
    local_28 = (byte)((UnicodeScalarValue & 0x1f0000) >> 0x12) | 0xf0;
    local_25 = (byte)((UnicodeScalarValue & 0x3f000) >> 0xc) | 0x80;
    local_26 = (byte)((UnicodeScalarValue & 0xfc0) >> 6) | 0x80;
    local_27 = local_19 & 0x3f | 0x80;
    local_24 = local_28;
    llvm::SmallVectorTemplateBase<char,_true>::push_back
              (&Result->super_SmallVectorTemplateBase<char,_true>,(char *)&local_28);
    local_29 = local_25;
    llvm::SmallVectorTemplateBase<char,_true>::push_back
              (&_ThirdByte->super_SmallVectorTemplateBase<char,_true>,(char *)&local_29);
    local_2a = local_26;
    llvm::SmallVectorTemplateBase<char,_true>::push_back
              (&_ThirdByte->super_SmallVectorTemplateBase<char,_true>,(char *)&local_2a);
    local_2b = local_27;
    llvm::SmallVectorTemplateBase<char,_true>::push_back
              (&_ThirdByte->super_SmallVectorTemplateBase<char,_true>,(char *)&local_2b);
  }
  return;
}

Assistant:

static void encodeUTF8( uint32_t UnicodeScalarValue
                      , SmallVectorImpl<char> &Result) {
  if (UnicodeScalarValue <= 0x7F) {
    Result.push_back(UnicodeScalarValue & 0x7F);
  } else if (UnicodeScalarValue <= 0x7FF) {
    uint8_t FirstByte = 0xC0 | ((UnicodeScalarValue & 0x7C0) >> 6);
    uint8_t SecondByte = 0x80 | (UnicodeScalarValue & 0x3F);
    Result.push_back(FirstByte);
    Result.push_back(SecondByte);
  } else if (UnicodeScalarValue <= 0xFFFF) {
    uint8_t FirstByte = 0xE0 | ((UnicodeScalarValue & 0xF000) >> 12);
    uint8_t SecondByte = 0x80 | ((UnicodeScalarValue & 0xFC0) >> 6);
    uint8_t ThirdByte = 0x80 | (UnicodeScalarValue & 0x3F);
    Result.push_back(FirstByte);
    Result.push_back(SecondByte);
    Result.push_back(ThirdByte);
  } else if (UnicodeScalarValue <= 0x10FFFF) {
    uint8_t FirstByte = 0xF0 | ((UnicodeScalarValue & 0x1F0000) >> 18);
    uint8_t SecondByte = 0x80 | ((UnicodeScalarValue & 0x3F000) >> 12);
    uint8_t ThirdByte = 0x80 | ((UnicodeScalarValue & 0xFC0) >> 6);
    uint8_t FourthByte = 0x80 | (UnicodeScalarValue & 0x3F);
    Result.push_back(FirstByte);
    Result.push_back(SecondByte);
    Result.push_back(ThirdByte);
    Result.push_back(FourthByte);
  }
}